

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

int __thiscall deqp::gls::DrawTest::init(DrawTest *this,EVP_PKEY_CTX *ctx)

{
  ChannelType CVar1;
  Primitive PVar2;
  pointer pDVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int extraout_EAX;
  ContextType ctxType;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar8;
  undefined4 extraout_var_01;
  GLContext *this_00;
  ReferenceContextBuffers *this_01;
  undefined4 extraout_var_02;
  ReferenceContext *this_02;
  AttributePack *pAVar9;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Primitive *pPVar10;
  ulong uVar11;
  ChannelOrder width;
  ChannelType height;
  ulong uVar12;
  float fVar13;
  bool local_104;
  MultisamplePixelBufferAccess local_100;
  MultisamplePixelBufferAccess local_d8;
  MultisamplePixelBufferAccess local_b0;
  ReferenceContextLimits limits;
  
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  width = *(ChannelOrder *)CONCAT44(extraout_var,iVar5);
  if (0x1ff < (int)width) {
    width = 0x200;
  }
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  CVar1 = *(ChannelType *)(CONCAT44(extraout_var_00,iVar5) + 4);
  height = 0x200;
  if ((int)CVar1 < 0x200) {
    height = CVar1;
  }
  pDVar3 = (this->m_specs).
           super__Vector_base<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)(this->m_specs).
                 super__Vector_base<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar3) / 0x50;
  uVar11 = 0;
  iVar5 = (int)uVar8;
  if (0 < iVar5) {
    uVar11 = uVar8 & 0xffffffff;
  }
  pPVar10 = &pDVar3->primitive;
  uVar8 = 0xffffffffffffffff;
  do {
    uVar12 = uVar11;
    if (uVar8 - uVar11 == -1) break;
    PVar2 = *pPVar10;
    uVar12 = uVar8 + 1;
    pPVar10 = pPVar10 + 0x14;
    uVar8 = uVar12;
  } while (4 < PVar2 - PRIMITIVE_LINES);
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar6 = (uint)(1 < *(int *)(CONCAT44(extraout_var_01,iVar6) + 0x20)) * 3 + 1;
  if ((long)iVar5 <= (long)uVar12) {
    iVar6 = 1;
  }
  sglr::ReferenceContextLimits::ReferenceContextLimits(&limits,this->m_renderCtx);
  this_00 = (GLContext *)operator_new(0x170);
  local_100.m_access.super_ConstPixelBufferAccess.m_format.order = R;
  local_100.m_access.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  local_100.m_access.super_ConstPixelBufferAccess.m_size.m_data[0] = width;
  local_100.m_access.super_ConstPixelBufferAccess.m_size.m_data[1] = height;
  sglr::GLContext::GLContext
            (this_00,this->m_renderCtx,((this->super_TestCase).super_TestNode.m_testCtx)->m_log,3,
             (IVec4 *)&local_100);
  this->m_glesContext = (Context *)this_00;
  uVar7 = (*this->m_renderCtx->_vptr_RenderContext[2])();
  if (((uVar7 & 0x3ff) != 2) &&
     (uVar7 = (*this->m_renderCtx->_vptr_RenderContext[2])(), (uVar7 & 0x3ff) != 3)) {
    ctxType.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
    bVar4 = glu::contextSupports(ctxType,(ApiType)0x13);
    if ((bVar4) ||
       (uVar7 = (*this->m_renderCtx->_vptr_RenderContext[2])(), (uVar7 & 0x300) == 0x100)) {
      local_104 = true;
      goto LAB_006db233;
    }
  }
  local_104 = false;
LAB_006db233:
  this_01 = (ReferenceContextBuffers *)operator_new(0x78);
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (this_01,(PixelFormat *)(CONCAT44(extraout_var_02,iVar5) + 8),0,0,width,height,iVar6);
  this->m_refBuffers = this_01;
  this_02 = (ReferenceContext *)operator_new(0x61b0);
  sglr::ReferenceContextBuffers::getColorbuffer(&local_100,this_01);
  sglr::ReferenceContextBuffers::getDepthbuffer(&local_b0,this->m_refBuffers);
  sglr::ReferenceContextBuffers::getStencilbuffer(&local_d8,this->m_refBuffers);
  sglr::ReferenceContext::ReferenceContext(this_02,&limits,&local_100,&local_b0,&local_d8);
  this->m_refContext = this_02;
  pAVar9 = (AttributePack *)operator_new(0x60);
  local_100.m_access.super_ConstPixelBufferAccess.m_format.type = height;
  local_100.m_access.super_ConstPixelBufferAccess.m_format.order = width;
  AttributePack::AttributePack
            (pAVar9,(this->super_TestCase).super_TestNode.m_testCtx,this->m_renderCtx,
             this->m_glesContext,(UVec2 *)&local_100,local_104,true);
  this->m_glArrayPack = pAVar9;
  pAVar9 = (AttributePack *)operator_new(0x60);
  AttributePack::AttributePack
            (pAVar9,(this->super_TestCase).super_TestNode.m_testCtx,this->m_renderCtx,
             &this->m_refContext->super_Context,(UVec2 *)&local_100,local_104,false);
  this->m_rrArrayPack = pAVar9;
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  fVar13 = ceilf((6.0 / (float)(1 << (*(byte *)(CONCAT44(extraout_var_03,iVar5) + 8) & 0x1f))) *
                 256.0);
  this->m_maxDiffRed = (int)fVar13;
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  fVar13 = ceilf((6.0 / (float)(1 << (*(byte *)(CONCAT44(extraout_var_04,iVar5) + 0xc) & 0x1f))) *
                 256.0);
  this->m_maxDiffGreen = (int)fVar13;
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  fVar13 = ceilf((6.0 / (float)(1 << (*(byte *)(CONCAT44(extraout_var_05,iVar5) + 0x10) & 0x1f))) *
                 256.0);
  this->m_maxDiffBlue = (int)fVar13;
  sglr::ReferenceContextLimits::~ReferenceContextLimits(&limits);
  return extraout_EAX;
}

Assistant:

void DrawTest::init (void)
{
	DE_ASSERT(!m_specs.empty());
	DE_ASSERT(contextSupports(m_renderCtx.getType(), m_specs[0].apiType));

	const int						renderTargetWidth	= de::min(MAX_RENDER_TARGET_SIZE, m_renderCtx.getRenderTarget().getWidth());
	const int						renderTargetHeight	= de::min(MAX_RENDER_TARGET_SIZE, m_renderCtx.getRenderTarget().getHeight());

	// lines have significantly different rasterization in MSAA mode
	const bool						isLineCase			= containsLineCases(m_specs);
	const bool						isMSAACase			= m_renderCtx.getRenderTarget().getNumSamples() > 1;
	const int						renderTargetSamples	= (isMSAACase && isLineCase) ? (4) : (1);

	sglr::ReferenceContextLimits	limits				(m_renderCtx);
	bool							useVao				= false;

	m_glesContext = new sglr::GLContext(m_renderCtx, m_testCtx.getLog(), sglr::GLCONTEXT_LOG_CALLS | sglr::GLCONTEXT_LOG_PROGRAMS, tcu::IVec4(0, 0, renderTargetWidth, renderTargetHeight));

	if (m_renderCtx.getType().getAPI() == glu::ApiType::es(2,0) || m_renderCtx.getType().getAPI() == glu::ApiType::es(3,0))
		useVao = false;
	else if (contextSupports(m_renderCtx.getType(), glu::ApiType::es(3,1)) || glu::isContextTypeGLCore(m_renderCtx.getType()))
		useVao = true;
	else
		DE_FATAL("Unknown context type");

	m_refBuffers	= new sglr::ReferenceContextBuffers(m_renderCtx.getRenderTarget().getPixelFormat(), 0, 0, renderTargetWidth, renderTargetHeight, renderTargetSamples);
	m_refContext	= new sglr::ReferenceContext(limits, m_refBuffers->getColorbuffer(), m_refBuffers->getDepthbuffer(), m_refBuffers->getStencilbuffer());

	m_glArrayPack	= new AttributePack(m_testCtx, m_renderCtx, *m_glesContext, tcu::UVec2(renderTargetWidth, renderTargetHeight), useVao, true);
	m_rrArrayPack	= new AttributePack(m_testCtx, m_renderCtx, *m_refContext,  tcu::UVec2(renderTargetWidth, renderTargetHeight), useVao, false);

	m_maxDiffRed	= deCeilFloatToInt32(256.0f * (6.0f / (float)(1 << m_renderCtx.getRenderTarget().getPixelFormat().redBits)));
	m_maxDiffGreen	= deCeilFloatToInt32(256.0f * (6.0f / (float)(1 << m_renderCtx.getRenderTarget().getPixelFormat().greenBits)));
	m_maxDiffBlue	= deCeilFloatToInt32(256.0f * (6.0f / (float)(1 << m_renderCtx.getRenderTarget().getPixelFormat().blueBits)));
}